

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  void *fd_ctx;
  ulong uVar2;
  ulong uVar3;
  long pts;
  undefined1 local_48 [8];
  FdOutContext out;
  FdInputContext in;
  
  iVar1 = parse_opt_open_file(argc,argv);
  if (iVar1 == 0) {
    fd_ctx = hevc_fast_dec_create((FdInputContext *)&out.width);
    divide_nalus();
    uVar2 = (ulong)au_pos;
    au_buf[uVar2] = buf_size;
    pts = 0;
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      hevc_fast_dec_decode
                (buf + au_buf[uVar3],au_buf[uVar3 + 1] - au_buf[uVar3],pts,fd_ctx,
                 (FdOutContext *)local_48);
      uVar2 = (ulong)au_pos;
      pts = pts + 0x28;
    }
    hevc_fast_dec_free(fd_ctx);
    free(buf);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char * const *argv)
{
    FdOutContext out;
    FdInputContext in;
    if(parse_opt_open_file(argc, argv))
        return -1;

    void *fd_ctx = hevc_fast_dec_create(&in);
    divide_nalus();

    au_buf[au_pos] = buf_size;
//    for(int i = 0; i <= au_pos; i++)
//        printf("%d\n", au_buf[i]);
    for(int i = 0; i < au_pos; i++)
    {
        int64_t pts = i * 40; //25fps
        hevc_fast_dec_decode(buf + au_buf[i], au_buf[i + 1] - au_buf[i], pts, fd_ctx, &out);
        if(out.got_frame)
        {
            //render
        }
    }



    hevc_fast_dec_free(fd_ctx);
    free(buf);
    return 0;
}